

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularString::GenerateMessageClearingCode
          (SingularString *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer *pPVar1;
  bool bVar2;
  Sub *local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  undefined1 local_181;
  char *local_180 [3];
  allocator<char> local_161;
  string local_160;
  Sub *local_140;
  Sub local_138;
  iterator local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_70;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  Printer *local_18;
  Printer *p_local;
  SingularString *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldGeneratorBase::is_oneof(&this->super_FieldGeneratorBase);
  pPVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&local_28,
               "\n      $field_$.Destroy();\n    ");
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit(pPVar1,local_28._M_allocated_capacity,local_28._8_8_);
  }
  else {
    bVar2 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
    if ((bVar2) &&
       (bVar2 = protobuf::internal::cpp::HasHasbit((this->super_FieldGeneratorBase).field_),
       pPVar1 = local_18, bVar2)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,"\n      $DCHK$(!$field_$.IsDefault());\n    ");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit(pPVar1,local_40._M_len,local_40._M_str);
    }
    bVar2 = EmptyDefault(this);
    pPVar1 = local_18;
    if (bVar2) {
      local_181 = 1;
      local_140 = &local_138;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"Clear",&local_161);
      bVar2 = protobuf::internal::cpp::HasHasbit((this->super_FieldGeneratorBase).field_);
      local_180[0] = "ClearToEmpty";
      if (bVar2) {
        local_180[0] = "ClearNonDefaultToEmpty";
      }
      protobuf::io::Printer::Sub::Sub<char_const*>(&local_138,&local_160,local_180);
      local_181 = 0;
      local_80 = &local_138;
      local_78 = 1;
      v._M_len = 1;
      v._M_array = local_80;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_70._M_local_buf,v);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_198,"\n            $field_$.$Clear$();\n          ");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit
                (pPVar1,local_70._M_allocated_capacity,local_70._8_8_,local_198._M_len,
                 local_198._M_str);
      local_1e0 = (Sub *)&local_80;
      do {
        local_1e0 = local_1e0 + -1;
        protobuf::io::Printer::Sub::~Sub(local_1e0);
      } while (local_1e0 != &local_138);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator(&local_161);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_58,"\n      $field_$.ClearToDefault($lazy_var$, GetArena());\n    ");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit(pPVar1,local_58._M_len,local_58._M_str);
    }
  }
  return;
}

Assistant:

void SingularString::GenerateMessageClearingCode(io::Printer* p) const {
  if (is_oneof()) {
    p->Emit(R"cc(
      $field_$.Destroy();
    )cc");
    return;
  }

  // Two-dimension specialization here: supporting arenas, field presence, or
  // not, and default value is the empty string or not. Complexity here ensures
  // the minimal number of branches / amount of extraneous code at runtime
  // (given that the below methods are inlined one-liners)!

  // If we have a hasbit, then the Clear() method of the protocol buffer
  // will have checked that this field is set.  If so, we can avoid redundant
  // checks against the default variable.

  if (is_inlined() && HasHasbit(field_)) {
    // Calling mutable_$name$() gives us a string reference and sets the has bit
    // for $name$ (in proto2).  We may get here when the string field is inlined
    // but the string's contents have not been changed by the user, so we cannot
    // make an assertion about the contents of the string and could never make
    // an assertion about the string instance.
    //
    // For non-inlined strings, we distinguish from non-default by comparing
    // instances, rather than contents.
    p->Emit(R"cc(
      $DCHK$(!$field_$.IsDefault());
    )cc");
  }

  if (!EmptyDefault()) {
    // Clear to a non-empty default is more involved, as we try to use the
    // Arena if one is present and may need to reallocate the string.
    p->Emit(R"cc(
      $field_$.ClearToDefault($lazy_var$, GetArena());
    )cc");
    return;
  }

  p->Emit({{"Clear",
            HasHasbit(field_) ? "ClearNonDefaultToEmpty" : "ClearToEmpty"}},
          R"cc(
            $field_$.$Clear$();
          )cc");
}